

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

string * libtorrent::extension(string *__return_storage_ptr__,string *f)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  size_t idx;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)f->_M_string_length;
  do {
    uVar4 = uVar4 - 1;
    if ((int)uVar4 + 1 < 1) {
      iVar3 = 2;
      break;
    }
    cVar1 = (f->_M_dataplus)._M_p[uVar4];
    if (cVar1 == '/') {
      bVar2 = false;
      iVar3 = 2;
    }
    else if (cVar1 == '.') {
      ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)f);
      iVar3 = 1;
      bVar2 = false;
    }
    else {
      iVar3 = 4;
      bVar2 = true;
    }
  } while (bVar2);
  if (iVar3 == 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string extension(std::string const& f)
	{
		for (int i = int(f.size()) - 1; i >= 0; --i)
		{
			auto const idx = static_cast<std::size_t>(i);
			if (f[idx] == '/') break;
#ifdef TORRENT_WINDOWS
			if (f[idx] == '\\') break;
#endif
			if (f[idx] != '.') continue;
			return f.substr(idx);
		}
		return "";
	}